

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_strtok.c
# Opt level: O2

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    /* The original PDCLib strtok() test */
    char s[] = "_a_bc__d_";
    rsize_t max = strlen( s );
    char * p;

    TESTCASE( _PDCLIB_strtok( s, &max, "_", &p ) == &s[1] );
    TESTCASE( max == 6 );
    TESTCASE( s[1] == 'a' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == &s[3] );
    TESTCASE( max == 3 );
    TESTCASE( s[3] == 'b' );
    TESTCASE( s[4] == 'c' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == &s[7] );
    TESTCASE( max == 0 );
    TESTCASE( s[6] == '_' );
    TESTCASE( s[7] == 'd' );
    TESTCASE( s[8] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == NULL );
    TESTCASE( max == 0 );
    strcpy( s, "ab_cd" );
    max = strlen( s );
    TESTCASE( _PDCLIB_strtok( s, &max, "_", &p ) == &s[0] );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[1] == 'b' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == &s[3] );
    TESTCASE( s[3] == 'c' );
    TESTCASE( s[4] == 'd' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == NULL );

    /* Testing the constraint handling */
    strcpy( s, "ab.cd" );
    max = 2;
    TESTCASE( set_constraint_handler_s( test_handler ) == abort_handler_s );
    TESTCASE( _PDCLIB_strtok( s, &max, ".", &p ) == NULL );
    TESTCASE( HANDLER_CALLS == 1 );

    {
        /* The strtok_s() example code from the standard */
        char str1[] = "?a???b,,,#c";
        char str2[] = "\t \t";
        rsize_t max1 = strlen( str1 );
        rsize_t max2 = strlen( str2 );
        char * ptr1;
        char * ptr2;

        TESTCASE( _PDCLIB_strtok( str1, &max1, "?", &ptr1 ) == &str1[1] );
        TESTCASE( _PDCLIB_strtok( NULL, &max1, ",", &ptr1 ) == &str1[3] );
        TESTCASE( _PDCLIB_strtok( str2, &max2, " \t", &ptr2 ) == NULL );
        TESTCASE( _PDCLIB_strtok( NULL, &max1, "#,", &ptr1 ) == &str1[10] );
        TESTCASE( _PDCLIB_strtok( NULL, &max1, "?", &ptr1 ) == NULL );
    }
#endif
    return TEST_RESULTS;
}